

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode pop3_disconnect(Curl_easy *data,connectdata *conn,_Bool dead_connection)

{
  CURLcode CVar1;
  CURLcode CVar2;
  undefined7 in_register_00000011;
  CURLcode result;
  pop3_conn *pop3c;
  
  if (((int)CONCAT71(in_register_00000011,dead_connection) == 0) &&
     (((conn->bits).field_0x1 & 0x20) != 0)) {
    CVar2 = CURLE_OK;
    CVar1 = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"%s","QUIT");
    if (CVar1 == CURLE_OK) {
      (data->conn->proto).pop3c.state = POP3_QUIT;
      while (((conn->proto).pop3c.state != POP3_STOP && (CVar2 == CURLE_OK))) {
        CVar2 = Curl_pp_statemach(data,&(conn->proto).ftpc.pp,true,true);
      }
    }
  }
  Curl_pp_disconnect(&(conn->proto).ftpc.pp);
  Curl_sasl_cleanup(conn,*(unsigned_short *)((long)&conn->proto + 0xd4));
  (*Curl_cfree)((void *)(conn->proto).imapc.dyn.toobig);
  (conn->proto).imapc.dyn.toobig = 0;
  return CURLE_OK;
}

Assistant:

static CURLcode pop3_disconnect(struct Curl_easy *data,
                                struct connectdata *conn, bool dead_connection)
{
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  (void)data;

  /* We cannot send quit unconditionally. If this connection is stale or
     bad in any way, sending quit and waiting around here will make the
     disconnect wait in vain and cause more problems than we need to. */

  if(!dead_connection && conn->bits.protoconnstart) {
    if(!pop3_perform_quit(data, conn))
      (void)pop3_block_statemach(data, conn, TRUE); /* ignore errors on QUIT */
  }

  /* Disconnect from the server */
  Curl_pp_disconnect(&pop3c->pp);

  /* Cleanup the SASL module */
  Curl_sasl_cleanup(conn, pop3c->sasl.authused);

  /* Cleanup our connection based variables */
  Curl_safefree(pop3c->apoptimestamp);

  return CURLE_OK;
}